

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O2

char * strstri(char *str,char *sub)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  char acStack_58 [24];
  char tsub [32];
  char tstr [32];
  
  bVar1 = *sub;
  if (bVar1 != 0) {
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      acStack_58[lVar6] = '\0';
      tsub[lVar6 + 8] = '\0';
    }
    for (uVar4 = 0; str[uVar4] != 0; uVar4 = uVar4 + 1) {
      tsub[(ulong)((byte)str[uVar4] & 0x1f) + 8] =
           tsub[(ulong)((byte)str[uVar4] & 0x1f) + 8] + '\x01';
    }
    pbVar7 = (byte *)(sub + 1);
    uVar11 = (uint)bVar1;
    while ((char)uVar11 != '\0') {
      acStack_58[uVar11 & 0x1f] = acStack_58[uVar11 & 0x1f] + '\x01';
      uVar4 = (ulong)((int)uVar4 - 1);
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
      uVar11 = (uint)bVar2;
    }
    if (-1 < (int)uVar4) {
      lVar6 = 0;
LAB_001a68dd:
      if (lVar6 != 0x20) goto code_r0x001a68e3;
      pcVar8 = str;
      for (uVar9 = 0; uVar9 <= (uVar4 & 0xffffffff); uVar9 = uVar9 + 1) {
        lVar6 = 0;
        uVar11 = (uint)bVar1;
        while( true ) {
          bVar2 = pcVar8[lVar6];
          bVar5 = bVar2 | 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar5 = bVar2;
          }
          bVar2 = (byte)uVar11;
          bVar10 = bVar2 | 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar10 = bVar2;
          }
          if (bVar5 != bVar10) break;
          lVar3 = lVar6 + 1;
          uVar11 = (uint)(byte)sub[lVar3];
          lVar6 = lVar6 + 1;
          if (sub[lVar3] == 0) {
            return str + uVar9;
          }
        }
        pcVar8 = pcVar8 + 1;
      }
    }
LAB_001a68f6:
    str = (char *)0x0;
  }
  return str;
code_r0x001a68e3:
  pcVar8 = acStack_58 + lVar6;
  lVar3 = lVar6 + 8;
  lVar6 = lVar6 + 1;
  if (tsub[lVar3] < *pcVar8) goto LAB_001a68f6;
  goto LAB_001a68dd;
}

Assistant:

char *strstri(const char *str, const char *sub)
{
    const char *s1, *s2;
    int i, k;
# define TABSIZ 0x20	/* 0x40 would be case-sensitive */
    char tstr[TABSIZ], tsub[TABSIZ];	/* nibble count tables */

    /* special case: empty substring */
    if (!*sub)	return (char *) str;

    /* do some useful work while determining relative lengths */
    for (i = 0; i < TABSIZ; i++)  tstr[i] = tsub[i] = 0;	/* init */
    for (k = 0, s1 = str; *s1; k++)  tstr[*s1++ & (TABSIZ-1)]++;
    for (	s2 = sub; *s2; --k)  tsub[*s2++ & (TABSIZ-1)]++;

    /* evaluate the info we've collected */
    if (k < 0)	return NULL;  /* sub longer than str, so can't match */
    for (i = 0; i < TABSIZ; i++)	/* does sub have more 'x's than str? */
	if (tsub[i] > tstr[i])	return NULL;  /* match not possible */

    /* now actually compare the substring repeatedly to parts of the string */
    for (i = 0; i <= k; i++) {
	s1 = &str[i];
	s2 = sub;
	while (lowc(*s1++) == lowc(*s2++))
	    if (!*s2)  return (char *) &str[i];		/* full match */
    }
    return NULL;	/* not found */
}